

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

void nullcRemoveModule(char *module)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  TraceScope traceScope;
  TraceScope local_30;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (nullcRemoveModule::token == '\0') {
      iVar4 = __cxa_guard_acquire(&nullcRemoveModule::token);
      if (iVar4 != 0) {
        nullcRemoveModule::token = NULLC::TraceGetToken("nullc","nullcRemoveModule");
        __cxa_guard_release(&nullcRemoveModule::token);
      }
    }
    NULLC::TraceScope::TraceScope(&local_30,nullcRemoveModule::token);
    lVar2 = NULLC::traceContext;
    sVar5 = strlen(module);
    uVar6 = (int)sVar5 + 1;
    uVar3 = *(uint *)(lVar2 + 0x264);
    if ((uVar3 <= *(int *)(lVar2 + 0x260) + uVar6) ||
       (*(int *)(lVar2 + 0x270) == *(int *)(lVar2 + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 <= uVar6) {
      __assert_fail("count < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x127,"void NULLC::TraceLabel(const char *)");
    }
    uVar3 = *(uint *)(lVar2 + 0x260);
    memcpy((void *)((ulong)uVar3 + *(long *)(lVar2 + 0x268)),module,(ulong)uVar6);
    *(int *)(lVar2 + 0x260) = *(int *)(lVar2 + 0x260) + uVar6;
    lVar1 = *(long *)(lVar2 + 0x278);
    uVar6 = *(uint *)(lVar2 + 0x270);
    *(uint *)(lVar2 + 0x270) = uVar6 + 1;
    *(uint *)(lVar1 + (ulong)uVar6 * 8) = uVar3 * 4 + 2;
    *(undefined4 *)(lVar1 + 4 + (ulong)uVar6 * 8) = 0;
    BinaryCache::RemoveBytecode(module);
    NULLC::TraceScope::~TraceScope(&local_30);
  }
  return;
}

Assistant:

void nullcRemoveModule(const char* module)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)false);

	TRACE_SCOPE("nullc", "nullcRemoveModule");
	TRACE_LABEL(module);

	BinaryCache::RemoveBytecode(module);
}